

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushID(int int_id)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *this;
  uint *puVar3;
  ImGuiContext *pIVar4;
  ImGuiID IVar5;
  uint *__dest;
  int iVar6;
  int iVar7;
  
  this = GImGui->CurrentWindow;
  this->Accessed = true;
  IVar5 = ImGuiWindow::GetID(this,(void *)(long)int_id);
  pIVar4 = GImGui;
  iVar7 = (this->IDStack).Size;
  iVar2 = (this->IDStack).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (uint *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 2);
      puVar3 = (this->IDStack).Data;
      if (puVar3 != (uint *)0x0) {
        memcpy(__dest,puVar3,(long)(this->IDStack).Size << 2);
      }
      puVar3 = (this->IDStack).Data;
      if (puVar3 != (uint *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(puVar3);
      (this->IDStack).Data = __dest;
      (this->IDStack).Capacity = iVar7;
    }
  }
  iVar7 = (this->IDStack).Size;
  (this->IDStack).Size = iVar7 + 1;
  (this->IDStack).Data[iVar7] = IVar5;
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    const void* ptr_id = (void*)(intptr_t)int_id;
    ImGuiWindow* window = GetCurrentWindow();
    window->IDStack.push_back(window->GetID(ptr_id));
}